

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O0

void __thiscall Diligent::DeviceContextVkImpl::CommitViewports(DeviceContextVkImpl *this)

{
  uint local_19c;
  undefined1 local_198 [4];
  Uint32 vp;
  VkViewport VkViewports [16];
  DeviceContextVkImpl *this_local;
  
  if ((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
      super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_NumViewports != 0) {
    for (local_19c = 0;
        local_19c <
        (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
        super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_NumViewports;
        local_19c = local_19c + 1) {
      *(Float32 *)(local_198 + (ulong)local_19c * 0x18) =
           (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
           super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_Viewports[local_19c].TopLeftX;
      VkViewports[(ulong)local_19c - 1].maxDepth =
           (float)(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                  super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_Viewports[local_19c].
                  TopLeftY;
      VkViewports[local_19c].x =
           (float)(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                  super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_Viewports[local_19c].Width
      ;
      VkViewports[local_19c].y =
           (float)(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                  super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_Viewports[local_19c].
                  Height;
      VkViewports[local_19c].width =
           (float)(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                  super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_Viewports[local_19c].
                  MinDepth;
      VkViewports[local_19c].height =
           (float)(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                  super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_Viewports[local_19c].
                  MaxDepth;
      VkViewports[(ulong)local_19c - 1].maxDepth =
           VkViewports[(ulong)local_19c - 1].maxDepth + VkViewports[local_19c].y;
      VkViewports[local_19c].y = -VkViewports[local_19c].y;
    }
    EnsureVkCmdBuffer(this);
    VulkanUtilities::VulkanCommandBuffer::SetViewports
              (&this->m_CommandBuffer,0,
               (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
               super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_NumViewports,
               (VkViewport *)local_198);
  }
  return;
}

Assistant:

void DeviceContextVkImpl::CommitViewports()
{
    if (m_NumViewports == 0)
        return;

    VkViewport VkViewports[MAX_VIEWPORTS]; // Do not waste time initializing array to zero
    for (Uint32 vp = 0; vp < m_NumViewports; ++vp)
    {
        VkViewports[vp].x        = m_Viewports[vp].TopLeftX;
        VkViewports[vp].y        = m_Viewports[vp].TopLeftY;
        VkViewports[vp].width    = m_Viewports[vp].Width;
        VkViewports[vp].height   = m_Viewports[vp].Height;
        VkViewports[vp].minDepth = m_Viewports[vp].MinDepth;
        VkViewports[vp].maxDepth = m_Viewports[vp].MaxDepth;

        // Turn the viewport upside down to be consistent with Direct3D. Note that in both APIs,
        // the viewport covers the same texture rows. The difference is that Direct3D inverts
        // normalized device Y coordinate when transforming NDC to window coordinates. In Vulkan
        // we achieve the same effect by using negative viewport height. Therefore we need to
        // invert normalized device Y coordinate when transforming to texture V
        //
        //
        //       Image                Direct3D                                       Image               Vulkan
        //        row                                                                 row
        //         0 _   (0,0)_______________________(1,0)                  Tex Height _   (0,1)_______________________(1,1)
        //         1 _       |                       |      |             VP Top + Hght _ _ _ _|   __________          |      A
        //         2 _       |                       |      |                          .       |  |   .--> +x|         |      |
        //           .       |                       |      |                          .       |  |   |      |         |      |
        //           .       |                       |      | V Coord                          |  |   V +y   |         |      | V Coord
        //     VP Top _ _ _ _|   __________          |      |                    VP Top _ _ _ _|  |__________|         |      |
        //           .       |  |    A +y  |         |      |                          .       |                       |      |
        //           .       |  |    |     |         |      |                          .       |                       |      |
        //           .       |  |    '-->+x|         |      |                        2 _       |                       |      |
        //           .       |  |__________|         |      |                        1 _       |                       |      |
        //Tex Height _       |_______________________|      V                        0 _       |_______________________|      |
        //               (0,1)                       (1,1)                                 (0,0)                       (1,0)
        //
        //

        VkViewports[vp].y      = VkViewports[vp].y + VkViewports[vp].height;
        VkViewports[vp].height = -VkViewports[vp].height;
    }
    EnsureVkCmdBuffer();
    // TODO: reinterpret_cast m_Viewports to VkViewports?
    m_CommandBuffer.SetViewports(0, m_NumViewports, VkViewports);
}